

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O2

uint32_t __thiscall
dg::Slicer<dg::LLVMNode>::mark
          (Slicer<dg::LLVMNode> *this,LLVMNode *start,uint32_t sl_id,bool forward_slice)

{
  long lVar1;
  long *plVar2;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> inslice;
  WalkAndMark<dg::LLVMNode> wm;
  LLVMNode *nd;
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  local_1b0;
  WalkAndMark<dg::LLVMNode> local_180;
  WalkAndMark<dg::LLVMNode> local_d8;
  
  if (sl_id == 0) {
    sl_id = this->slice_id + 1;
    this->slice_id = sl_id;
  }
  WalkAndMark<dg::LLVMNode>::WalkAndMark(&local_180,forward_slice);
  WalkAndMark<dg::LLVMNode>::mark(&local_180,start,sl_id);
  if (forward_slice) {
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1b0._M_impl.super__Rb_tree_header._M_header;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; (_Rb_tree_header *)
           local_180.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_180.markedBlocks._M_t._M_impl.super__Rb_tree_header;
        local_180.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment
                       (local_180.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
        ) {
      lVar1 = *(long *)(local_180.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                       + 1);
      plVar2 = (long *)(lVar1 + 0x10);
      while (plVar2 = (long *)*plVar2, plVar2 != (long *)(lVar1 + 0x10)) {
        local_d8.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk
             = (_func_int **)plVar2[2];
        if (*(uint32_t *)
             (local_d8.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
              _vptr_NodesWalk + 0x39) == sl_id) {
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>
                    ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                      *)&local_1b0,(LLVMNode **)&local_d8);
        }
      }
    }
    if (local_1b0._M_impl.super__Rb_tree_header._M_node_count != 0) {
      WalkAndMark<dg::LLVMNode>::WalkAndMark(&local_d8,false);
      WalkAndMark<dg::LLVMNode>::mark
                (&local_d8,
                 (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
                 &local_1b0,sl_id);
      WalkAndMark<dg::LLVMNode>::~WalkAndMark(&local_d8);
    }
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::~_Rb_tree(&local_1b0);
  }
  WalkAndMark<dg::LLVMNode>::~WalkAndMark(&local_180);
  return sl_id;
}

Assistant:

uint32_t mark(NodeT *start, uint32_t sl_id = 0,
                  bool forward_slice = false) {
        if (sl_id == 0)
            sl_id = ++slice_id;

        WalkAndMark<NodeT> wm(forward_slice);
        wm.mark(start, sl_id);

        ///
        // If we are performing forward slicing,
        // we must do the slice executable as we now just
        // marked the nodes that are data dependent on the
        // slicing criterion. We do that by using these
        // nodes as slicing criteria in normal backward slicing.
        if (forward_slice) {
            std::set<NodeT *> inslice;
            for (auto *BB : wm.getMarkedBlocks()) {
#if ENABLE_CFG
                for (auto *nd : BB->getNodes()) {
                    if (nd->getSlice() == sl_id) {
                        inslice.insert(nd);
                    }
                }
#endif
            }

            // do backward slicing to make the slice executable
            if (!inslice.empty()) {
                WalkAndMark<NodeT> wm2;
                wm2.mark(inslice, sl_id);
            }
        }

        return sl_id;
    }